

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

bool __thiscall smf::MidiMessage::isPressure(MidiMessage *this)

{
  byte *pbVar1;
  size_type sVar2;
  MidiMessage *this_local;
  
  pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  if ((*pbVar1 & 0xf0) == 0xd0) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    if (sVar2 == 2) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MidiMessage::isPressure(void) const {
	if (((*this)[0] & 0xf0) != 0xd0) {
		return false;
	} else if (size() != 2) {
		return false;
	} else {
		return true;
	}
}